

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O1

charcount_t utf8::ByteIndexIntoCharacterIndex(LPCUTF8 pch,size_t cbIndex,DecodeOptions options)

{
  uint *end;
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  char cVar4;
  charcount_t cVar5;
  LPCUTF8 s;
  uint *puVar6;
  DecodeOptions local_3c;
  uint *puStack_38;
  DecodeOptions localOptions;
  LPCUTF8 pchCurrent;
  
  end = (uint *)(pch + cbIndex);
  puVar6 = (uint *)(pch + (cbIndex - 4));
  cVar5 = 0;
  local_3c = options;
  puStack_38 = (uint *)pch;
  if (((ulong)pch & 3) != 0) goto LAB_006965af;
LAB_00696587:
  do {
    if (pch < puVar6) {
      uVar2 = *(uint *)pch;
      if ((uVar2 & 0x80808080) == 0) {
        pch = (LPCUTF8)((long)pch + 4);
        cVar5 = cVar5 + 4;
        puStack_38 = (uint *)pch;
      }
      if ((uVar2 & 0x80808080) == 0) goto LAB_00696587;
    }
LAB_006965af:
    do {
      puVar3 = puStack_38;
      if (end <= puStack_38) {
        return cVar5;
      }
      puVar1 = (uint *)((long)puStack_38 + 1);
      uVar2 = *puStack_38;
      puStack_38 = puVar1;
      if ((char)(byte)uVar2 < '\0') {
        DecodeTail((ushort)(byte)uVar2,(LPCUTF8 *)&stack0xffffffffffffffc8,(LPCUTF8)end,&local_3c,
                   (bool *)0x0);
      }
      cVar4 = (((ulong)puStack_38 & 3) == 0) * '\x03';
      if (puVar3 == puStack_38) {
        cVar4 = '\a';
      }
      cVar5 = cVar5 + (puVar3 != puStack_38);
    } while (cVar4 == '\0');
    pch = (LPCUTF8)puStack_38;
    if (cVar4 != '\x03') {
      return cVar5;
    }
  } while( true );
}

Assistant:

charcount_t ByteIndexIntoCharacterIndex(__in_ecount(cbIndex) LPCUTF8 pch, size_t cbIndex, DecodeOptions options)
    {
        DecodeOptions localOptions = options;
        LPCUTF8 pchCurrent = pch;
        LPCUTF8 pchEnd = pch + cbIndex;
        LPCUTF8 pchEndMinus4 = pch + (cbIndex - 4);
        charcount_t i = 0;

        // Avoid using a reinterpret_cast to start a misaligned read.
        if (!IsAligned(pchCurrent)) goto LSlowPath;

LFastPath:
        // Skip 4 bytes at a time.
        while (pchCurrent < pchEndMinus4)
        {
            uint32 ch4 = *reinterpret_cast<const uint32 *>(pchCurrent);
            if ((ch4 & 0x80808080) == 0)
            {
                pchCurrent += 4;
                i += 4;
            }
            else break;
        }

LSlowPath:
        while (pchCurrent < pchEnd)
        {
            LPCUTF8 s = pchCurrent;
            Decode(pchCurrent, pchEnd, localOptions);
            if (s == pchCurrent) break;
            i++;

            // Try to return to the fast path avoiding misaligned reads.
            if (IsAligned(pchCurrent)) goto LFastPath;
        }

        return i;
    }